

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coda-definition-parse.c
# Opt level: O2

int cd_integer_set_conversion(parser_info *info)

{
  int iVar1;
  
  iVar1 = coda_type_number_set_conversion
                    ((coda_type_number *)info->node->parent->data,
                     (coda_conversion *)info->node->data);
  if (iVar1 == 0) {
    info->node->data = (void *)0x0;
    iVar1 = 0;
  }
  else {
    iVar1 = -1;
  }
  return iVar1;
}

Assistant:

static int cd_integer_set_conversion(parser_info *info)
{
    if (coda_type_number_set_conversion((coda_type_number *)info->node->parent->data,
                                        (coda_conversion *)info->node->data) != 0)
    {
        return -1;
    }
    info->node->data = NULL;
    return 0;
}